

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)

{
  SUNMemoryHelper __ptr;
  SUNMemoryHelper_Ops p_Var1;
  
  if ((sunctx != (SUNContext)0x0) &&
     (__ptr = (SUNMemoryHelper)malloc(0x18), __ptr != (SUNMemoryHelper)0x0)) {
    p_Var1 = (SUNMemoryHelper_Ops)calloc(1,0x30);
    __ptr->ops = p_Var1;
    if (p_Var1 != (SUNMemoryHelper_Ops)0x0) {
      __ptr->content = (void *)0x0;
      __ptr->sunctx = sunctx;
      return __ptr;
    }
    free(__ptr);
  }
  return (SUNMemoryHelper)0x0;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)
{
  SUNMemoryHelper helper = NULL;

  if (sunctx == NULL) return(NULL);

  helper = (SUNMemoryHelper) malloc(sizeof(struct _SUNMemoryHelper));
  if (helper == NULL)
  {
    SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_NewEmpty: malloc failed\n");
    return(NULL);
  }

  helper->ops = (SUNMemoryHelper_Ops) malloc(sizeof(struct _SUNMemoryHelper_Ops));
  if (helper->ops == NULL)
  {
    SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_NewEmpty: malloc failed\n");
    free(helper);
    return(NULL);
  }

  /* Set all ops to NULL */
  memset(helper->ops, 0, sizeof(struct _SUNMemoryHelper_Ops));
  helper->content = NULL;
  helper->sunctx = sunctx;

  return(helper);
}